

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall
Lowerer::GenerateGetSingleCharString
          (Lowerer *this,RegOpnd *charCodeOpnd,Opnd *resultOpnd,LabelInstr *labelHelper,
          LabelInstr *doneLabel,Instr *instr,bool isCodePoint)

{
  LowererMD *this_00;
  BYTE scale;
  int iVar1;
  LabelInstr *target;
  RegOpnd *baseOpnd;
  undefined4 extraout_var;
  AddrOpnd *src;
  IntConstOpnd *compareSrc2;
  IndirOpnd *src_00;
  Opnd *src_01;
  HelperCallOpnd *src1Opnd;
  Instr *instr_00;
  Lowerer *this_01;
  JnHelperMethod fnHelper;
  undefined1 local_60 [8];
  AutoReuseOpnd autoReuseCacheRegOpnd;
  
  autoReuseCacheRegOpnd._16_8_ = labelHelper;
  target = IR::LabelInstr::New(Label,this->m_func,false);
  baseOpnd = IR::RegOpnd::New(TyVar,instr->m_func);
  local_60 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_60,&baseOpnd->super_Opnd,instr->m_func,true);
  iVar1 = (*instr->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x11])();
  src = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar1),AddrOpndKindDynamicCharStringCache,
                          instr->m_func,false,(Var)0x0);
  InsertMove(&baseOpnd->super_Opnd,&src->super_Opnd,instr,true);
  this_01 = (Lowerer *)&DAT_00000080;
  compareSrc2 = IR::IntConstOpnd::New(0x80,TyUint32,this->m_func,false);
  InsertCompareBranch(this_01,&charCodeOpnd->super_Opnd,&compareSrc2->super_Opnd,BrGe_A,true,target,
                      instr,false);
  scale = LowererMDArch::GetDefaultIndirScale();
  src_00 = IR::IndirOpnd::New(baseOpnd,charCodeOpnd,scale,TyVar,instr->m_func);
  InsertMove(resultOpnd,&src_00->super_Opnd,instr,true);
  InsertTest(resultOpnd,resultOpnd,instr);
  InsertBranch(BrEq_A,false,(LabelInstr *)autoReuseCacheRegOpnd._16_8_,instr);
  InsertMove(instr->m_dst,resultOpnd,instr,true);
  InsertBranch(Br,false,doneLabel,instr);
  IR::Instr::InsertBefore(instr,&target->super_Instr);
  fnHelper = HelperGetStringForCharCodePoint;
  if (!isCodePoint) {
    src_01 = IR::Opnd::UseWithNewType(&charCodeOpnd->super_Opnd,TyUint16,instr->m_func);
    fnHelper = HelperGetStringForChar;
    InsertMove(&charCodeOpnd->super_Opnd,src_01,instr,true);
  }
  this_00 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_00,instr,&charCodeOpnd->super_Opnd);
  LowererMD::LoadHelperArgument(this_00,instr,&baseOpnd->super_Opnd);
  src1Opnd = IR::HelperCallOpnd::New(fnHelper,this->m_func);
  instr_00 = IR::Instr::New(Call,resultOpnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,instr_00);
  LowererMD::LowerCall(this_00,instr_00,0);
  InsertMove(instr->m_dst,resultOpnd,instr,true);
  InsertBranch(Br,false,doneLabel,instr);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_60);
  return;
}

Assistant:

void
Lowerer::GenerateGetSingleCharString(IR::RegOpnd * charCodeOpnd, IR::Opnd * resultOpnd, IR::LabelInstr * labelHelper, IR::LabelInstr * doneLabel, IR::Instr * instr, bool isCodePoint)
{
    //      MOV cacheReg, CharStringCache
    //      CMP charCodeOpnd, Js::ScriptContext::CharStringCacheSize
    //      JAE $labelWCharStringCheck                                   <
    //      MOV resultOpnd, cacheReg[charCodeOpnd]
    //      TST resultOpnd, resultOpnd          //Check for null
    //      JEQ $helper
    //      JMP $Done
    //
    //$labelWCharStringCheck:
    //            Arg1 =  charCodeOpnd
    //            Arg0 =  cacheReg
    //      resultOpnd =  Call HelperGetStringForCharW/CodePoint
    //      JMP $Done
    //$helper:

    IR::LabelInstr *labelWCharStringCheck = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

    //Try to load from in  CharStringCacheA
    IR::RegOpnd *cacheRegOpnd = IR::RegOpnd::New(TyVar, instr->m_func);
    IR::AutoReuseOpnd autoReuseCacheRegOpnd(cacheRegOpnd, instr->m_func);

    Assert(Js::JavascriptLibrary::GetCharStringCacheAOffset() == Js::JavascriptLibrary::GetCharStringCacheOffset());
    InsertMove(cacheRegOpnd, this->LoadLibraryValueOpnd(instr, LibraryValue::ValueCharStringCache), instr);

    InsertCompareBranch(charCodeOpnd, IR::IntConstOpnd::New(Js::CharStringCache::CharStringCacheSize, TyUint32, this->m_func), Js::OpCode::BrGe_A, true, labelWCharStringCheck, instr);
    InsertMove(resultOpnd, IR::IndirOpnd::New(cacheRegOpnd, charCodeOpnd, this->m_lowererMD.GetDefaultIndirScale(), TyVar, instr->m_func), instr);

    InsertTestBranch(resultOpnd, resultOpnd, Js::OpCode::BrEq_A, labelHelper, instr);

    InsertMove(instr->GetDst(), resultOpnd, instr);
    InsertBranch(Js::OpCode::Br, doneLabel, instr);

    instr->InsertBefore(labelWCharStringCheck);

    IR::JnHelperMethod helperMethod;
    if (isCodePoint)
    {
        helperMethod = IR::HelperGetStringForCharCodePoint;
    }
    else
    {
        InsertMove(charCodeOpnd, charCodeOpnd->UseWithNewType(TyUint16, instr->m_func), instr);
        helperMethod = IR::HelperGetStringForChar;
    }

    //Try to load from in  CharStringCacheW or CharStringCacheCodePoint, this is a helper call.

    this->m_lowererMD.LoadHelperArgument(instr, charCodeOpnd);
    this->m_lowererMD.LoadHelperArgument(instr, cacheRegOpnd);
    IR::Instr* helperCallInstr = IR::Instr::New(Js::OpCode::Call, resultOpnd, IR::HelperCallOpnd::New(helperMethod, this->m_func), this->m_func);
    instr->InsertBefore(helperCallInstr);
    this->m_lowererMD.LowerCall(helperCallInstr, 0);

    InsertMove(instr->GetDst(), resultOpnd, instr);
    InsertBranch(Js::OpCode::Br, doneLabel, instr);
}